

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O2

int bip39_get_wordlist(char *lang,words **output)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (output == (words **)0x0) {
    iVar2 = -2;
  }
  else {
    *output = &en_words;
    iVar2 = 0;
    if (lang != (char *)0x0) {
      lVar1 = 0;
      do {
        lVar3 = lVar1;
        if (lVar3 + 0x10 == 0x80) {
          return 0;
        }
        iVar2 = strcmp(lang,lookup[0].name + lVar3);
        lVar1 = lVar3 + 0x10;
      } while (iVar2 != 0);
      *output = *(words **)(lookup[0].name + lVar3 + 8);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int bip39_get_wordlist(const char *lang, struct words **output)
{
    size_t i;

    if (!output)
        return WALLY_EINVAL;

    *output = (struct words *)&en_words; /* Fallback to English if not found */

    if (lang)
        for (i = 0; i < sizeof(lookup) / sizeof(lookup[0]); ++i)
            if (!strcmp(lang, lookup[i].name)) {
                *output = (struct words *)lookup[i].words;
                break;
            }
    return WALLY_OK;
}